

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUSSEImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPUSSEImpl<double,_2,_0>::calcPartialsPartialsFixedScaling
          (BeagleCPUSSEImpl<double,_2,_0> *this,double *destP,double *partials1,double *matrices1,
          double *partials2,double *matrices2,double *scaleFactors,int startPattern,int endPattern)

{
  double dVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  double *pdVar10;
  int k;
  long lVar11;
  int iVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  
  uVar4 = (ulong)(this->super_BeagleCPUImpl<double,_2,_0>).kPartialsPaddedStateCount;
  lVar6 = uVar4 - 1;
  for (iVar12 = 0; iVar12 < (this->super_BeagleCPUImpl<double,_2,_0>).kCategoryCount;
      iVar12 = iVar12 + 1) {
    iVar7 = ((this->super_BeagleCPUImpl<double,_2,_0>).kPatternCount * iVar12 + startPattern) *
            (int)uVar4;
    pdVar10 = destP + iVar7;
    for (lVar11 = (long)startPattern; lVar11 < endPattern; lVar11 = lVar11 + 1) {
      iVar8 = (this->super_BeagleCPUImpl<double,_2,_0>).kStateCount;
      dVar1 = scaleFactors[lVar11];
      iVar3 = (this->super_BeagleCPUImpl<double,_2,_0>).kMatrixSize * iVar12;
      for (iVar9 = 0; iVar9 < iVar8; iVar9 = iVar9 + 1) {
        dVar13 = 0.0;
        dVar14 = 0.0;
        dVar15 = 0.0;
        dVar16 = 0.0;
        for (lVar5 = 0; lVar5 < lVar6; lVar5 = lVar5 + 2) {
          dVar13 = dVar13 + matrices1[iVar3 + lVar5] * partials1[iVar7 + lVar5];
          dVar14 = dVar14 + (matrices1 + iVar3 + lVar5)[1] * (partials1 + iVar7 + lVar5)[1];
          dVar15 = dVar15 + matrices2[iVar3 + lVar5] * partials2[iVar7 + lVar5];
          dVar16 = dVar16 + (matrices2 + iVar3 + lVar5)[1] * (partials2 + iVar7 + lVar5)[1];
        }
        *pdVar10 = ((dVar13 + dVar14) * (dVar15 + dVar16)) / dVar1;
        pdVar10 = pdVar10 + 1;
        iVar8 = (this->super_BeagleCPUImpl<double,_2,_0>).kStateCount;
        iVar3 = iVar3 + 2 + iVar8;
      }
      uVar2 = (this->super_BeagleCPUImpl<double,_2,_0>).kPartialsPaddedStateCount;
      uVar4 = (ulong)uVar2;
      iVar7 = iVar7 + uVar2;
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_SSE_TEMPLATE
void BeagleCPUSSEImpl<BEAGLE_CPU_SSE_DOUBLE>::calcPartialsPartialsFixedScaling(double* __restrict destP,
                                                                               const double* __restrict  partials1,
                                                                               const double*  __restrict  matrices1,
                                                                               const double*  __restrict  partials2,
                                                                               const double* __restrict  matrices2,
                                                                               const double* __restrict scaleFactors,
                                                                               int startPattern,
                                                                               int endPattern) {

    int stateCountMinusOne = kPartialsPaddedStateCount - 1;
#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
      int v = l*kPartialsPaddedStateCount*kPatternCount + kPartialsPaddedStateCount*startPattern;
      double* destPu = destP + v;
        for (int k = startPattern; k < endPattern; k++) {
            int w = l * kMatrixSize;
            const V_Real scalar = VEC_SPLAT(scaleFactors[k]);
            for (int i = 0; i < kStateCount; i++) {

            	V_Real sum1_vec;
            	V_Real sum2_vec;

              	int j = 0;
            	sum1_vec = VEC_SETZERO();
            	sum2_vec = VEC_SETZERO();
            	for ( ; j < stateCountMinusOne; j += 2) {
            		sum1_vec = VEC_MADD(
								 VEC_LOAD(matrices1 + w + j),  // TODO This only works if w is even
								 VEC_LOAD(partials1 + v + j),  // TODO This only works if v is even
								 sum1_vec);
            		sum2_vec = VEC_MADD(
								 VEC_LOAD(matrices2 + w + j),
								 VEC_LOAD(partials2 + v + j),
								 sum2_vec);
            	}
                VEC_STORE_SCALAR(destPu,
                		VEC_DIV(VEC_MULT(
                				VEC_ADD(sum1_vec, VEC_SWAP(sum1_vec)),
                				VEC_ADD(sum2_vec, VEC_SWAP(sum2_vec))
                		), scalar));


                // increment for the extra column at the end
                w += kStateCount + T_PAD;

                destPu++;
            }
            if (P_PAD) {
                for (int pad = 0; pad < P_PAD; pad++)  {
                    *(destPu++) = 0.0;
                }
            }
            v += kPartialsPaddedStateCount;
        }
    }
}